

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O2

int __thiscall google::protobuf::io::GzipOutputStream::Deflate(GzipOutputStream *this,int flush)

{
  void **ppvVar1;
  int *piVar2;
  int iVar3;
  string *psVar4;
  bool bVar5;
  LogMessageFatal local_40 [16];
  
  ppvVar1 = &this->sub_data_;
  piVar2 = &this->sub_data_size_;
  bVar5 = (this->zcontext_).avail_out == 0;
  do {
    if ((*ppvVar1 == (void *)0x0) || (bVar5)) {
      iVar3 = (*this->sub_stream_->_vptr_ZeroCopyOutputStream[2])(this->sub_stream_,ppvVar1,piVar2);
      if ((char)iVar3 == '\0') {
        iVar3 = -5;
        goto LAB_0027ad58;
      }
      psVar4 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_
                         (*piVar2,0,"sub_data_size_ > 0");
      if (psVar4 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/gzip_stream.cc"
                   ,0xf0,psVar4->_M_string_length,(psVar4->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
      }
      (this->zcontext_).next_out = (Bytef *)this->sub_data_;
      (this->zcontext_).avail_out = this->sub_data_size_;
    }
    iVar3 = deflate(&this->zcontext_,flush);
    bVar5 = true;
  } while (iVar3 == 0 && (this->zcontext_).avail_out == 0);
  if (flush - 3U < 2) {
    (*this->sub_stream_->_vptr_ZeroCopyOutputStream[3])();
LAB_0027ad58:
    *ppvVar1 = (void *)0x0;
    *piVar2 = 0;
  }
  return iVar3;
}

Assistant:

int GzipOutputStream::Deflate(int flush) {
  int error = Z_OK;
  do {
    if ((sub_data_ == NULL) || (zcontext_.avail_out == 0)) {
      bool ok = sub_stream_->Next(&sub_data_, &sub_data_size_);
      if (!ok) {
        sub_data_ = NULL;
        sub_data_size_ = 0;
        return Z_BUF_ERROR;
      }
      ABSL_CHECK_GT(sub_data_size_, 0);
      zcontext_.next_out = static_cast<Bytef*>(sub_data_);
      zcontext_.avail_out = sub_data_size_;
    }
    error = deflate(&zcontext_, flush);
  } while (error == Z_OK && zcontext_.avail_out == 0);
  if ((flush == Z_FULL_FLUSH) || (flush == Z_FINISH)) {
    // Notify lower layer of data.
    sub_stream_->BackUp(zcontext_.avail_out);
    // We don't own the buffer anymore.
    sub_data_ = NULL;
    sub_data_size_ = 0;
  }
  return error;
}